

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O2

void __thiscall SpotLight_Power_Test::TestBody(SpotLight_Power_Test *this)

{
  int iVar1;
  Allocator alloc;
  int i;
  uint64_t a;
  char *message;
  undefined1 auVar2 [16];
  Float FVar3;
  undefined1 auVar4 [16];
  SampledSpectrum SVar5;
  SampledSpectrum SVar6;
  Vector3f wl;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  double local_1e0;
  AssertHelper local_1d8;
  AssertionResult gtest_ar;
  float local_1b8;
  SampledWavelengths lambda;
  SpectrumHandle local_180;
  SpotLight light;
  Transform id;
  
  if (TestBody()::I == '\0') {
    iVar1 = __cxa_guard_acquire(&TestBody()::I);
    if (iVar1 != 0) {
      TestBody::I.c = 10.0;
      __cxa_guard_release(&TestBody()::I);
    }
  }
  pbrt::Transform::Transform(&id);
  lambda.lambda.values[0] = 0.0;
  lambda.lambda.values[1] = 0.0;
  lambda.lambda.values[2] = 0.0;
  lambda.lambda.values[3] = 0.0;
  local_180.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )0x1000002f327d0;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::SpotLight::SpotLight(&light,&id,(MediumInterface *)&lambda,&local_180,1.0,60.0,40.0,alloc);
  pbrt::SampledWavelengths::SampleUniform(&lambda,0.5,360.0,830.0);
  SVar5 = pbrt::SpotLight::Phi(&light,&lambda);
  local_1e0 = 0.0;
  for (a = 0; a != 0x100000; a = a + 1) {
    FVar3 = pbrt::RadicalInverse(0,a);
    gtest_ar._4_4_ = pbrt::RadicalInverse(1,a);
    gtest_ar._0_4_ = FVar3;
    wl = pbrt::SampleUniformSphere((Point2f *)&gtest_ar);
    SVar6 = pbrt::SpotLight::I(&light,wl,&lambda);
    local_1e0 = local_1e0 + (double)SVar6.values.values[0];
  }
  local_1e0 = local_1e0 / 83443.0234375;
  local_1b8 = SVar5.values.values[0];
  local_1d8.data_ = (AssertHelperData *)0x3f50624dd2f1a9fc;
  auVar2._8_8_ = 0x7fffffffffffffff;
  auVar2._0_8_ = 0x7fffffffffffffff;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_1e0 - (double)local_1b8;
  auVar2 = vandpd_avx512vl(auVar4,auVar2);
  local_1e8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       vmovlpd_avx(auVar2);
  testing::internal::CmpHelperLT<double,double>
            ((internal *)&gtest_ar,"std::abs(phiSampled - phi[0])","1e-3",(double *)&local_1e8,
             (double *)&local_1d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1e8);
    std::operator<<((ostream *)(local_1e8.ptr_ + 0x10)," qmc: ");
    std::ostream::_M_insert<double>(local_1e0);
    std::operator<<((ostream *)(local_1e8.ptr_ + 0x10),", closed-form: ");
    std::ostream::operator<<(local_1e8.ptr_ + 0x10,local_1b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
               ,0x28,message);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&light.Iemit.values);
  return;
}

Assistant:

TEST(SpotLight, Power) {
    static ConstantSpectrum I(10.);
    Transform id;
    SpotLight light(id, MediumInterface(), &I, 1.f /* scale */, 60 /* total width */,
                    40 /* falloff start */, Allocator());

    SampledWavelengths lambda = SampledWavelengths::SampleUniform(0.5);
    SampledSpectrum phi = light.Phi(lambda);

    int nSamples = 1024 * 1024;
    double phiSampled = 0;
    for (int i = 0; i < nSamples; ++i) {
        Vector3f w = SampleUniformSphere({RadicalInverse(0, i), RadicalInverse(1, i)});
        phiSampled += light.I(w, lambda)[0];
    }
    phiSampled /= (nSamples * UniformSpherePDF());

    EXPECT_LT(std::abs(phiSampled - phi[0]), 1e-3)
        << " qmc: " << phiSampled << ", closed-form: " << phi[0];
}